

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O3

FailCodeType __thiscall
mittens::GenericExceptionHandler<void,_mittens::UnHandler<int>,_mittens::DefaultNoAction<void>_>::
handleException(GenericExceptionHandler<void,_mittens::UnHandler<int>,_mittens::DefaultNoAction<void>_>
                *this)

{
  FailCodeType FVar1;
  
  FVar1 = UnHandler<int>::handleException((UnHandler<int> *)&this->field_0x4);
  return FVar1;
}

Assistant:

FailCodeType handleException()
      {
         try
         {
            return nestedHandler();
         }
         catch (...)
         {            
            try 
            { 
               // Run custom action. 
               // If the return type of the custom action is the same as FailCodeType (as opposed to void or even less plausible something else)
               // then return the result of custom action as the fail code.
               using ReturnActionResult = typename std::is_same< FailCodeType, decltype(customAction_())>::type;
               return runAction(ReturnActionResult{});
            }
            catch (...) 
            { 
               // Force the action no-throw by suppressing any exceptions unless requested not to.
               if (!supressExceptionsInAction_)
                  throw; 
            } 
            return failCode_;
         }
      }